

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::tls1_write_channel_id(SSL_HANDSHAKE *hs,CBB *cbb)

{
  bool bVar1;
  int iVar2;
  EC_KEY *key;
  EC_GROUP *group;
  EC_POINT *p;
  UniquePtr<BIGNUM> x;
  UniquePtr<ECDSA_SIG> sig;
  UniquePtr<BIGNUM> y;
  size_t digest_len;
  CBB child;
  uint8_t digest [64];
  _Head_base<0UL,_bignum_st_*,_false> local_a8;
  _Head_base<0UL,_ecdsa_sig_st_*,_false> local_a0;
  _Head_base<0UL,_bignum_st_*,_false> local_98;
  int local_90 [2];
  CBB local_88;
  uint8_t local_58 [64];
  
  bVar1 = tls1_channel_id_hash(hs,local_58,(size_t *)local_90);
  if (!bVar1) {
    return false;
  }
  key = EVP_PKEY_get0_EC_KEY
                  ((hs->config->channel_id_private)._M_t.
                   super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
  if (key == (EC_KEY *)0x0) {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x121e);
    return false;
  }
  local_a8._M_head_impl = (bignum_st *)BN_new();
  local_98._M_head_impl = (bignum_st *)BN_new();
  if ((BIGNUM *)local_98._M_head_impl != (BIGNUM *)0x0 &&
      (BIGNUM *)local_a8._M_head_impl != (BIGNUM *)0x0) {
    group = EC_KEY_get0_group((EC_KEY *)key);
    p = EC_KEY_get0_public_key((EC_KEY *)key);
    iVar2 = EC_POINT_get_affine_coordinates_GFp
                      (group,p,(BIGNUM *)local_a8._M_head_impl,(BIGNUM *)local_98._M_head_impl,
                       (BN_CTX *)0x0);
    if (iVar2 != 0) {
      local_a0._M_head_impl = (ecdsa_sig_st *)ECDSA_do_sign(local_58,local_90[0],(EC_KEY *)key);
      if (((((ECDSA_SIG *)local_a0._M_head_impl == (ECDSA_SIG *)0x0) ||
           (iVar2 = CBB_add_u16(cbb,0x7550), iVar2 == 0)) ||
          (iVar2 = CBB_add_u16_length_prefixed(cbb,&local_88), iVar2 == 0)) ||
         (((iVar2 = BN_bn2cbb_padded(&local_88,0x20,local_a8._M_head_impl), iVar2 == 0 ||
           (iVar2 = BN_bn2cbb_padded(&local_88,0x20,local_98._M_head_impl), iVar2 == 0)) ||
          ((iVar2 = BN_bn2cbb_padded(&local_88,0x20,(BIGNUM *)(local_a0._M_head_impl)->r),
           iVar2 == 0 ||
           (iVar2 = BN_bn2cbb_padded(&local_88,0x20,(BIGNUM *)(local_a0._M_head_impl)->s),
           iVar2 == 0)))))) {
        bVar1 = false;
      }
      else {
        iVar2 = CBB_flush(cbb);
        bVar1 = iVar2 != 0;
      }
      std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)&local_a0);
      goto LAB_0023cbb3;
    }
  }
  bVar1 = false;
LAB_0023cbb3:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_98);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_a8);
  return bVar1;
}

Assistant:

bool tls1_write_channel_id(SSL_HANDSHAKE *hs, CBB *cbb) {
  uint8_t digest[EVP_MAX_MD_SIZE];
  size_t digest_len;
  if (!tls1_channel_id_hash(hs, digest, &digest_len)) {
    return false;
  }

  EC_KEY *ec_key = EVP_PKEY_get0_EC_KEY(hs->config->channel_id_private.get());
  if (ec_key == nullptr) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  UniquePtr<BIGNUM> x(BN_new()), y(BN_new());
  if (!x || !y ||
      !EC_POINT_get_affine_coordinates_GFp(EC_KEY_get0_group(ec_key),
                                           EC_KEY_get0_public_key(ec_key),
                                           x.get(), y.get(), nullptr)) {
    return false;
  }

  UniquePtr<ECDSA_SIG> sig(ECDSA_do_sign(digest, digest_len, ec_key));
  if (!sig) {
    return false;
  }

  CBB child;
  if (!CBB_add_u16(cbb, TLSEXT_TYPE_channel_id) ||  //
      !CBB_add_u16_length_prefixed(cbb, &child) ||  //
      !BN_bn2cbb_padded(&child, 32, x.get()) ||     //
      !BN_bn2cbb_padded(&child, 32, y.get()) ||     //
      !BN_bn2cbb_padded(&child, 32, sig->r) ||      //
      !BN_bn2cbb_padded(&child, 32, sig->s) ||      //
      !CBB_flush(cbb)) {
    return false;
  }

  return true;
}